

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_MixedEditionAndSyntax_Test::TestBody
          (ParseEditionsTest_MixedEditionAndSyntax_Test *this)

{
  string_view text;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&MStack_28,"2:8: Expected top-level statement (e.g. \"message\").\n");
  text._M_str = 
  "\n        edition = \"2023\";\n        syntax = \"proto2\";\n        message A {\n          int32 b = 1;\n        }"
  ;
  text._M_len = 0x6a;
  ParserTest::ExpectHasErrors
            (&this->super_ParseEditionsTest,text,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&MStack_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&MStack_28);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, MixedEditionAndSyntax) {
  ExpectHasErrors(
      R"schema(
        edition = "2023";
        syntax = "proto2";
        message A {
          int32 b = 1;
        })schema",
      "2:8: Expected top-level statement (e.g. \"message\").\n");
}